

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_dr_flac_ogg__read_page_header_after_capture_pattern
                    (ma_dr_flac_read_proc onRead,void *pUserData,ma_dr_flac_ogg_page_header *pHeader
                    ,ma_uint32 *pBytesRead,ma_uint32 *pCRC32)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ma_result mVar6;
  byte local_58;
  ma_uint8 local_57;
  ma_uint64 local_56;
  undefined8 local_4e;
  ma_uint32 local_46;
  byte local_42;
  ma_uint32 *local_38;
  
  sVar2 = (*onRead)(pUserData,&local_58,0x17);
  mVar6 = MA_AT_END;
  if (sVar2 == 0x17) {
    *pBytesRead = *pBytesRead + 0x17;
    builtin_memcpy(pHeader->capturePattern,"OggS",4);
    pHeader->structureVersion = local_58;
    pHeader->headerType = local_57;
    pHeader->granulePosition = local_56;
    pHeader->serialNumber = (undefined4)local_4e;
    pHeader->sequenceNumber = local_4e._4_4_;
    pHeader->checksum = local_46;
    pHeader->segmentCount = local_42;
    local_46 = 0;
    uVar4 = *pCRC32;
    lVar3 = 0;
    do {
      uVar4 = uVar4 << 8 ^ ma_dr_flac__crc32_table[uVar4 >> 0x18 ^ (uint)(&local_58)[lVar3]];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x17);
    *pCRC32 = uVar4;
    local_38 = pBytesRead;
    sVar2 = (*onRead)(pUserData,pHeader->segmentTable,(ulong)local_42);
    bVar1 = pHeader->segmentCount;
    mVar6 = MA_AT_END;
    if (sVar2 == bVar1) {
      *local_38 = *local_38 + (uint)bVar1;
      if (bVar1 == 0) {
        mVar6 = MA_SUCCESS;
      }
      else {
        uVar4 = *pCRC32;
        mVar6 = MA_SUCCESS;
        uVar5 = 0;
        do {
          uVar4 = uVar4 << 8 ^
                  ma_dr_flac__crc32_table[uVar4 >> 0x18 ^ (uint)pHeader->segmentTable[uVar5]];
          *pCRC32 = uVar4;
          uVar5 = uVar5 + 1;
        } while (bVar1 != uVar5);
      }
    }
  }
  return mVar6;
}

Assistant:

static ma_result ma_dr_flac_ogg__read_page_header_after_capture_pattern(ma_dr_flac_read_proc onRead, void* pUserData, ma_dr_flac_ogg_page_header* pHeader, ma_uint32* pBytesRead, ma_uint32* pCRC32)
{
    ma_uint8 data[23];
    ma_uint32 i;
    MA_DR_FLAC_ASSERT(*pCRC32 == MA_DR_FLAC_OGG_CAPTURE_PATTERN_CRC32);
    if (onRead(pUserData, data, 23) != 23) {
        return MA_AT_END;
    }
    *pBytesRead += 23;
    pHeader->capturePattern[0] = 'O';
    pHeader->capturePattern[1] = 'g';
    pHeader->capturePattern[2] = 'g';
    pHeader->capturePattern[3] = 'S';
    pHeader->structureVersion = data[0];
    pHeader->headerType       = data[1];
    MA_DR_FLAC_COPY_MEMORY(&pHeader->granulePosition, &data[ 2], 8);
    MA_DR_FLAC_COPY_MEMORY(&pHeader->serialNumber,    &data[10], 4);
    MA_DR_FLAC_COPY_MEMORY(&pHeader->sequenceNumber,  &data[14], 4);
    MA_DR_FLAC_COPY_MEMORY(&pHeader->checksum,        &data[18], 4);
    pHeader->segmentCount     = data[22];
    data[18] = 0;
    data[19] = 0;
    data[20] = 0;
    data[21] = 0;
    for (i = 0; i < 23; ++i) {
        *pCRC32 = ma_dr_flac_crc32_byte(*pCRC32, data[i]);
    }
    if (onRead(pUserData, pHeader->segmentTable, pHeader->segmentCount) != pHeader->segmentCount) {
        return MA_AT_END;
    }
    *pBytesRead += pHeader->segmentCount;
    for (i = 0; i < pHeader->segmentCount; ++i) {
        *pCRC32 = ma_dr_flac_crc32_byte(*pCRC32, pHeader->segmentTable[i]);
    }
    return MA_SUCCESS;
}